

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_collector.hpp
# Opt level: O2

void __thiscall duckdb::ArrowCollectorLocalState::FinishArray(ArrowCollectorLocalState *this)

{
  unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>,_true> *this_00;
  idx_t iVar1;
  pointer pAVar2;
  pointer pAVar3;
  long lVar4;
  ArrowArray *pAVar5;
  byte bVar6;
  templated_unique_single_t finished_array;
  ArrowArray local_68;
  
  bVar6 = 0;
  make_uniq<duckdb::ArrowArrayWrapper>();
  this_00 = &this->appender;
  pAVar2 = unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>,_true>::
           operator->(this_00);
  iVar1 = pAVar2->row_count;
  pAVar2 = unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>,_true>::
           operator->(this_00);
  ArrowAppender::Finalize(&local_68,pAVar2);
  pAVar3 = unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>
           ::operator->(&finished_array);
  pAVar5 = &local_68;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pAVar3->arrow_array).length = pAVar5->length;
    pAVar5 = (ArrowArray *)((long)pAVar5 + ((ulong)bVar6 * -2 + 1) * 8);
    pAVar3 = (pointer)((long)pAVar3 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  ::std::__uniq_ptr_impl<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>::reset
            ((__uniq_ptr_impl<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_> *)
             this_00,(pointer)0x0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>>>
              *)&this->finished_arrays,&finished_array);
  this->tuple_count = this->tuple_count + iVar1;
  ::std::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>_>::
  ~unique_ptr(&finished_array.
               super_unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>_>
             );
  return;
}

Assistant:

void FinishArray() {
		auto finished_array = make_uniq<ArrowArrayWrapper>();
		auto row_count = appender->RowCount();
		finished_array->arrow_array = appender->Finalize();
		appender.reset();
		finished_arrays.push_back(std::move(finished_array));
		tuple_count += row_count;
	}